

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.hpp
# Opt level: O0

void __thiscall
OpenMD::TimeCorrFunc<OpenMD::DynamicVector<double,_std::allocator<double>_>_>::~TimeCorrFunc
          (TimeCorrFunc<OpenMD::DynamicVector<double,_std::allocator<double>_>_> *this)

{
  undefined8 *in_RDI;
  vector<OpenMD::DynamicVector<double,_std::allocator<double>_>,_std::allocator<OpenMD::DynamicVector<double,_std::allocator<double>_>_>_>
  *unaff_retaddr;
  DumpReader *this_00;
  
  *in_RDI = &PTR__TimeCorrFunc_004e4158;
  this_00 = (DumpReader *)in_RDI[0x14];
  if (this_00 != (DumpReader *)0x0) {
    DumpReader::~DumpReader(this_00);
    operator_delete(this_00,0x1258);
  }
  std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::~unique_ptr
            ((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *)
             unaff_retaddr);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 0x1b1));
  std::__cxx11::string::~string((string *)(in_RDI + 0x1ad));
  std::__cxx11::string::~string((string *)(in_RDI + 0x1a9));
  SelectionEvaluator::~SelectionEvaluator((SelectionEvaluator *)this_00);
  SelectionEvaluator::~SelectionEvaluator((SelectionEvaluator *)this_00);
  std::__cxx11::string::~string((string *)(in_RDI + 0x50));
  std::__cxx11::string::~string((string *)(in_RDI + 0x4c));
  SelectionManager::~SelectionManager((SelectionManager *)this_00);
  SelectionManager::~SelectionManager((SelectionManager *)this_00);
  std::__cxx11::string::~string((string *)(in_RDI + 0x15));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::
  vector<OpenMD::DynamicVector<double,_std::allocator<double>_>,_std::allocator<OpenMD::DynamicVector<double,_std::allocator<double>_>_>_>
  ::~vector(unaff_retaddr);
  DynamicProperty::~DynamicProperty((DynamicProperty *)0x18a6ab);
  return;
}

Assistant:

virtual ~TimeCorrFunc() { delete reader_; }